

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

Token __thiscall flow::lang::Lexer::parseNumber(Lexer *this,int base)

{
  ulong uVar1;
  int iVar2;
  Token TVar3;
  int iVar4;
  bool firstComplete;
  char cVar5;
  allocator<char> local_49;
  Report *local_48;
  _List_node_base *local_38;
  
  cVar5 = (char)this + -0x58;
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  this->numberValue_ = 0;
  iVar4 = this->currentChar_;
  if (0x2f < iVar4) {
    do {
      if (base <= iVar4 + -0x30) break;
      this->numberValue_ = (long)(iVar4 + -0x30) + this->numberValue_ * (long)base;
      std::__cxx11::string::push_back(cVar5);
      nextChar(this,true);
      iVar4 = this->currentChar_;
    } while (0x2f < iVar4);
  }
  uVar1 = (this->stringValue_)._M_string_length;
  if (iVar4 == 0x3a && uVar1 < 5) {
    firstComplete = true;
  }
  else {
    if ((3 < uVar1) || (iVar2 = isxdigit(iVar4), iVar2 == 0)) {
      if (iVar4 == 0x2e) {
        std::__cxx11::string::push_back(cVar5);
        nextChar(this,true);
        iVar4 = this->currentChar_;
        while (iVar4 - 0x30U < 10) {
          std::__cxx11::string::push_back(cVar5);
          nextChar(this,true);
          iVar4 = this->currentChar_;
        }
        nextChar(this,true);
        if (iVar4 == 0x2e) {
          std::__cxx11::string::push_back(cVar5);
          iVar4 = this->currentChar_;
          while (iVar4 - 0x30U < 10) {
            std::__cxx11::string::push_back(cVar5);
            nextChar(this,true);
            iVar4 = this->currentChar_;
          }
          nextChar(this,true);
          if (iVar4 == 0x2e) {
            std::__cxx11::string::push_back(cVar5);
            iVar4 = this->currentChar_;
            while (iVar4 - 0x30U < 10) {
              std::__cxx11::string::push_back(cVar5);
              nextChar(this,true);
              iVar4 = this->currentChar_;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&stack0xffffffffffffffb8,(this->stringValue_)._M_dataplus._M_p,
                       &local_49);
            (this->ipValue_).family_ = V4;
            iVar4 = inet_pton(2,(char *)local_48,(this->ipValue_).buf_);
            if (iVar4 < 1) {
              if (iVar4 < 0) {
                perror("inet_pton");
              }
              else {
                parseNumber((Lexer *)&stack0xffffffffffffffb8);
              }
              (this->ipValue_).cstr_[0] = '\0';
            }
            else {
              strncpy((this->ipValue_).cstr_,(char *)local_48,0x2e);
            }
            if (local_48 != (Report *)&stack0xffffffffffffffc8) {
              operator_delete(local_48,(ulong)((long)&local_38->_M_next + 1));
            }
            if (this->currentChar_ == 0x2f) {
              TVar3 = continueCidr(this,0x20);
              return TVar3;
            }
            this->token_ = IP;
            return IP;
          }
        }
        this->token_ = Unknown;
        TVar3 = Unknown;
      }
      else {
        this->token_ = Number;
        TVar3 = Number;
      }
      return TVar3;
    }
    firstComplete = false;
  }
  TVar3 = continueParseIPv6(this,firstComplete);
  return TVar3;
}

Assistant:

Token Lexer::parseNumber(int base) {
  stringValue_.clear();
  numberValue_ = 0;

  while (currentChar() >= '0' && (currentChar() - '0') < base) {
    numberValue_ *= base;
    numberValue_ += currentChar() - '0';
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // ipv6HexDigit4 *(':' ipv6HexDigit4) ['::' [ipv6HexSeq]]
  if (stringValue_.size() <= 4 && currentChar() == ':')
    return continueParseIPv6(true);

  if (stringValue_.size() < 4 && isHexChar())
    return continueParseIPv6(false);

  if (currentChar() != '.')
    return token_ = Token::Number;

  // 2nd IP component
  stringValue_ += '.';
  nextChar();
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // 3rd IP component
  if (!consume('.')) return token_ = Token::Unknown;

  stringValue_ += '.';
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  // 4th IP component
  if (!consume('.')) return token_ = Token::Unknown;

  stringValue_ += '.';
  while (std::isdigit(currentChar())) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  ipValue_.set(stringValue_.c_str(), util::IPAddress::Family::V4);

  if (currentChar() != '/') return token_ = Token::IP;

  // IPv4 CIDR
  return continueCidr(32);
}